

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# portability_atexit.c
# Opt level: O0

int portability_atexit_register(portability_atexit_fn handler)

{
  atexit_node_type *paVar1;
  portability_atexit_fn in_RDI;
  atexit_node_type *node;
  atexit_node_type *iterator;
  atexit_node_type *local_18;
  int local_4;
  
  if (atexit_list == (atexit_node_type *)0x0) {
    local_4 = 1;
  }
  else if (atexit_list->handler == (portability_atexit_fn)0x0) {
    atexit_list->handler = in_RDI;
LAB_0010278e:
    local_4 = 0;
  }
  else {
    for (local_18 = atexit_list; local_18->handler != in_RDI; local_18 = local_18->next) {
      if (local_18->next == (atexit_node_type *)0x0) {
        paVar1 = (atexit_node_type *)malloc(0x10);
        if (paVar1 == (atexit_node_type *)0x0) {
          return 1;
        }
        paVar1->handler = in_RDI;
        paVar1->next = atexit_list;
        atexit_list = paVar1;
        goto LAB_0010278e;
      }
    }
    local_4 = 1;
  }
  return local_4;
}

Assistant:

int portability_atexit_register(portability_atexit_fn handler)
{
	if (atexit_list == NULL)
	{
		return 1;
	}

	if (atexit_list->handler == NULL)
	{
		atexit_list->handler = handler;
	}
	else
	{
		struct atexit_node_type *iterator = atexit_list;

		/* Find the last or duplicates */
		for (;;)
		{
			if (iterator->handler == handler)
			{
				/* Already registered, skip */
				return 1;
			}

			if (iterator->next == NULL)
			{
				break;
			}

			iterator = iterator->next;
		}

		/* Allocate the new node */
		struct atexit_node_type *node = malloc(sizeof(struct atexit_node_type));

		if (node == NULL)
		{
			return 1;
		}

		node->handler = handler;
		node->next = atexit_list;

		/* Insert it at the begining */
		atexit_list = node;
	}

	return 0;
}